

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcher_tests.cpp
# Opt level: O2

void __thiscall iu_Matcher_x_iutest_x_Pair_Test::Body(iu_Matcher_x_iutest_x_Pair_Test *this)

{
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *v;
  AssertionResult *in_R8;
  AssertionResult iutest_ar;
  string local_228;
  string local_208;
  iuCodeMessage local_1e8;
  AssertionResult local_1b8;
  undefined1 local_190 [16];
  undefined **local_180;
  iuCodeMessage *local_178;
  undefined4 local_170;
  
  local_178 = &local_1e8;
  local_1e8.m_message._M_dataplus._M_p._0_4_ = 10;
  local_190._0_8_ = &PTR__EachMatcher_00226568;
  local_190._8_8_ = &PTR__PairMatcher_00226528;
  local_180 = &PTR__IMatcher_00224780;
  local_170 = 100;
  iutest::detail::EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>>::
  operator()(&local_1b8,
             (EachMatcher<iutest::detail::PairMatcher<iutest::detail::LeMatcher<int>,int>> *)
             local_190,
             (map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
             (anonymous_namespace)::gm);
  if (local_1b8.m_result == false) {
    memset((iu_global_format_stringstream *)local_190,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
    iutest::PrintToString<std::map<int,int,std::less<int>,std::allocator<std::pair<int_const,int>>>>
              (&local_228,(iutest *)(anonymous_namespace)::gm,v);
    iutest::detail::MatcherAssertionFailureMessage_abi_cxx11_
              (&local_208,(detail *)local_228._M_dataplus._M_p,"Each(Pair(Le(10), 100))",
               (char *)&local_1b8,in_R8);
    iutest::detail::iuCodeMessage::iuCodeMessage
              (&local_1e8,
               "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/matcher_tests.cpp"
               ,0x161,local_208._M_dataplus._M_p);
    local_1e8._44_4_ = 1;
    iutest::AssertionHelper::operator=((AssertionHelper *)&local_1e8,(Fixed *)local_190);
    std::__cxx11::string::~string((string *)&local_1e8);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_228);
    iutest::iu_global_format_stringstream::~iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_190);
  }
  std::__cxx11::string::~string((string *)&local_1b8);
  return;
}

Assistant:

IUTEST(Matcher, Pair)
{
    IUTEST_EXPECT_THAT(gm, Each(Pair(Le(10), 100)));
}